

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::makeFourierGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          int *anisotropic_weights,int *level_limits)

{
  int size;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  size = 0;
  if (type - type_curved < 6) {
    size = *(int *)(&DAT_001ce074 + (ulong)(type - type_curved) * 4);
  }
  Utils::copyArray<int_const,int>
            ((vector<int,_std::allocator<int>_> *)&local_60,(Utils *)anisotropic_weights,
             (int *)(ulong)(uint)(dimensions << ((byte)size & 0x1f)),size);
  Utils::copyArray<int_const,int>
            ((vector<int,_std::allocator<int>_> *)&local_48,(Utils *)level_limits,
             (int *)(ulong)(uint)dimensions,size);
  makeFourierGrid(this,dimensions,outputs,depth,type,(vector<int,_std::allocator<int>_> *)&local_60,
                  (vector<int,_std::allocator<int>_> *)&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void TasmanianSparseGrid::makeFourierGrid(int dimensions, int outputs, int depth, TypeDepth type, const int* anisotropic_weights, const int* level_limits){
    makeFourierGrid(dimensions, outputs, depth, type, Utils::copyArray(anisotropic_weights, (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions),
                    Utils::copyArray(level_limits, dimensions));
}